

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O2

int __thiscall
t_program::collection_typename_count<std::vector<t_enum*,std::allocator<t_enum*>>>
          (t_program *this,t_program *prog,
          vector<t_enum_*,_std::allocator<t_enum_*>_> *type_collection,t_type *t)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  pointer pptVar4;
  
  iVar3 = 0;
  for (pptVar4 = (type_collection->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      (type_collection->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if (*pptVar4 != (t_enum *)t) {
      iVar2 = (*(t->super_t_doc)._vptr_t_doc[3])(t);
      (*((*pptVar4)->super_t_type).super_t_doc._vptr_t_doc[3])();
      iVar2 = std::__cxx11::string::compare((string *)CONCAT44(extraout_var,iVar2));
      if (iVar2 == 0) {
        bVar1 = is_common_namespace(this,prog,t);
        iVar3 = iVar3 + (uint)bVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int collection_typename_count(const t_program* prog, const T type_collection, const t_type* t) const {
    int occurrences = 0;
    for (auto it = type_collection.cbegin(); it != type_collection.cend(); ++it)
      if (t != *it && 0 == t->get_name().compare((*it)->get_name()) && is_common_namespace(prog, t))
        ++occurrences;
    return occurrences;
  }